

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng64.c
# Opt level: O0

void dss_random64(long *tgt,long nLow,long nHigh,long nStream)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long nTemp;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  if ((in_RCX < 0) || (local_20 = in_RCX, 0x2f < in_RCX)) {
    local_20 = 0;
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDX < in_RSI) {
    local_18 = in_RSI;
    local_10 = in_RDX;
  }
  lVar1 = NextRand64(Seed[local_20].value);
  Seed[local_20].value = lVar1;
  local_28 = Seed[local_20].value;
  if (local_28 < 0) {
    local_28 = -local_28;
  }
  *in_RDI = local_10 + local_28 % ((local_18 - local_10) + 1);
  Seed[local_20].usage = Seed[local_20].usage + 1;
  Seed[local_20].nCalls = Seed[local_20].nCalls + 1;
  return;
}

Assistant:

void
dss_random64(DSS_HUGE *tgt, DSS_HUGE nLow, DSS_HUGE nHigh, long nStream)
{
    DSS_HUGE            nTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;

    if (nLow > nHigh)
    {
        nTemp = nLow;
        nLow = nHigh;
        nHigh = nTemp;
    }

    Seed[nStream].value = NextRand64(Seed[nStream].value);
    nTemp = Seed[nStream].value;
    if (nTemp < 0) 
	nTemp = -nTemp;
    nTemp %= (nHigh - nLow + 1);
    *tgt = nLow + nTemp;
    Seed[nStream].usage += 1;
#ifdef RNG_TEST
   Seed[nStream].nCalls += 1;
#endif

	return;
}